

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doublingfactorcounter_test.cpp
# Opt level: O3

Utest * __thiscall
TEST_DoublingFactorCounterTest_Not_OneSetOfIdenticalSequences_Open_TestShell::createTest
          (TEST_DoublingFactorCounterTest_Not_OneSetOfIdenticalSequences_Open_TestShell *this)

{
  TEST_DoublingFactorCounterTest_Not_OneSetOfIdenticalSequences_Open_Test *this_00;
  
  this_00 = (TEST_DoublingFactorCounterTest_Not_OneSetOfIdenticalSequences_Open_Test *)
            operator_new(0xc0,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/doublingfactorcounter_test.cpp"
                         ,0xc5);
  TEST_DoublingFactorCounterTest_Not_OneSetOfIdenticalSequences_Open_Test::
  TEST_DoublingFactorCounterTest_Not_OneSetOfIdenticalSequences_Open_Test(this_00);
  return (Utest *)this_00;
}

Assistant:

TEST(DoublingFactorCounterTest, Not_OneSetOfIdenticalSequences_Open)
{
	addPair(Tile::SouthWind);	
	addSequence(Tile::OneOfCharacters, false);
	addSequence(Tile::TwoOfCircles, false);
	addSequence(Tile::TwoOfCircles, false);	
	addTriplet(Tile::NineOfBamboos, true);

	s.selfDrawn();
	auto r = c.report();

	CHECK(r.patterns.empty());
}